

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall FormatterTest_HashFlag_Test::TestBody(FormatterTest_HashFlag_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_string_view<char> format_str_13;
  basic_string_view<char> format_str_14;
  basic_string_view<char> format_str_15;
  basic_string_view<char> format_str_16;
  basic_string_view<char> format_str_17;
  basic_string_view<char> format_str_18;
  basic_string_view<char> format_str_19;
  basic_string_view<char> format_str_20;
  basic_string_view<char> format_str_21;
  basic_string_view<char> format_str_22;
  basic_string_view<char> format_str_23;
  basic_string_view<char> format_str_24;
  basic_string_view<char> format_str_25;
  basic_string_view<char> format_str_26;
  basic_string_view<char> format_str_27;
  basic_string_view<char> format_str_28;
  basic_string_view<char> format_str_29;
  basic_string_view<char> format_str_30;
  basic_string_view<char> format_str_31;
  basic_string_view<char> format_str_32;
  basic_string_view<char> format_str_33;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_06;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_07;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_08;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_09;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_10;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_11;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_12;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_13;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_14;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_15;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_16;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_17;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_18;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_19;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_20;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_21;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_22;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_23;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_24;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_25;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_26;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_27;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_28;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_29;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_30;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_31;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_32;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_33;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar_34;
  char *local_348;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  AssertionResult local_318;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_300;
  undefined1 *local_2f8;
  long local_2f0;
  undefined8 local_2e8;
  undefined1 local_2e0 [504];
  AssertionResult local_e8;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined8 local_58 [2];
  undefined8 local_48 [3];
  
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str.size_ = 5;
  format_str.data_ = "{0:#}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
                ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str,args,(locale_ref)0x0);
  paVar1 = &local_338.field_2;
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&local_348,"\"42\"","format(\"{0:#}\", 42)",(char (*) [3])0x242e5f,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3ff,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0xffffff;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_00.size_ = 5;
  format_str_00.data_ = "{0:#}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_00,args_00,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_348,"\"-42\"","format(\"{0:#}\", -42)",(char (*) [4])0x23b7d2,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x400,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_01.size_ = 6;
  format_str_01.data_ = "{0:#b}";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_01,args_01,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&local_348,"\"0b101010\"","format(\"{0:#b}\", 42)",(char (*) [9])0x23a90d,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x401,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_02.size_ = 6;
  format_str_02.data_ = "{0:#B}";
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_02.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_02,args_02,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&local_348,"\"0B101010\"","format(\"{0:#B}\", 42)",(char (*) [9])"0B101010"
             ,&local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x402,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0xffffff;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_03.size_ = 6;
  format_str_03.data_ = "{0:#b}";
  args_03.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_03.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_03,args_03,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&local_348,"\"-0b101010\"","format(\"{0:#b}\", -42)",
             (char (*) [10])"-0b101010",&local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x403,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_04.size_ = 6;
  format_str_04.data_ = "{0:#x}";
  args_04.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_04.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_04,args_04,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_348,"\"0x42\"","format(\"{0:#x}\", 0x42)",(char (*) [5])0x23a986,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x404,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_05.size_ = 6;
  format_str_05.data_ = "{0:#X}";
  args_05.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_05.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_05,args_05,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_348,"\"0X42\"","format(\"{0:#X}\", 0x42)",(char (*) [5])"0X42",
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x405,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0xffffff;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_06.size_ = 6;
  format_str_06.data_ = "{0:#x}";
  args_06.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_06.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_06,args_06,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_348,"\"-0x42\"","format(\"{0:#x}\", -0x42)",(char (*) [6])"-0x42",
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x406,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_07.size_ = 6;
  format_str_07.data_ = "{0:#o}";
  args_07.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_07.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_07,args_07,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_348,"\"042\"","format(\"{0:#o}\", 042)",(char (*) [4])0x23a9c6,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x407,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0xffffff;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_08.size_ = 6;
  format_str_08.data_ = "{0:#o}";
  args_08.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_08.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_08,args_08,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_348,"\"-042\"","format(\"{0:#o}\", -042)",(char (*) [5])"-042",
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x408,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_09.size_ = 5;
  format_str_09.data_ = "{0:#}";
  args_09.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_09.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_09,args_09,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&local_348,"\"42\"","format(\"{0:#}\", 42u)",(char (*) [3])0x242e5f,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x409,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_10.size_ = 6;
  format_str_10.data_ = "{0:#x}";
  args_10.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_10.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_10,args_10,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_348,"\"0x42\"","format(\"{0:#x}\", 0x42u)",(char (*) [5])0x23a986,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x40a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_11.size_ = 6;
  format_str_11.data_ = "{0:#o}";
  args_11.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_11.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_11,args_11,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_348,"\"042\"","format(\"{0:#o}\", 042u)",(char (*) [4])0x23a9c6,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x40b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0xffffffffffffff;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_12.size_ = 5;
  format_str_12.data_ = "{0:#}";
  args_12.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_12.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_12,args_12,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_348,"\"-42\"","format(\"{0:#}\", -42l)",(char (*) [4])0x23b7d2,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x40d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_13.size_ = 6;
  format_str_13.data_ = "{0:#x}";
  args_13.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_13.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_13,args_13,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_348,"\"0x42\"","format(\"{0:#x}\", 0x42l)",(char (*) [5])0x23a986,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x40e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0xffffffffffffff;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_14.size_ = 6;
  format_str_14.data_ = "{0:#x}";
  args_14.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_14.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_14,args_14,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_348,"\"-0x42\"","format(\"{0:#x}\", -0x42l)",(char (*) [6])"-0x42",
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x40f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_15.size_ = 6;
  format_str_15.data_ = "{0:#o}";
  args_15.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_15.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_15,args_15,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_348,"\"042\"","format(\"{0:#o}\", 042l)",(char (*) [4])0x23a9c6,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x410,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0xffffffffffffff;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_16.size_ = 6;
  format_str_16.data_ = "{0:#o}";
  args_16.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_16.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_16,args_16,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_348,"\"-042\"","format(\"{0:#o}\", -042l)",(char (*) [5])"-042",
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x411,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_17.size_ = 5;
  format_str_17.data_ = "{0:#}";
  args_17.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_17.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_17,args_17,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&local_348,"\"42\"","format(\"{0:#}\", 42ul)",(char (*) [3])0x242e5f,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x412,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_18.size_ = 6;
  format_str_18.data_ = "{0:#x}";
  args_18.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_18.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_18,args_18,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_348,"\"0x42\"","format(\"{0:#x}\", 0x42ul)",(char (*) [5])0x23a986,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x413,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_19.size_ = 6;
  format_str_19.data_ = "{0:#o}";
  args_19.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_19.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_19,args_19,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_348,"\"042\"","format(\"{0:#o}\", 042ul)",(char (*) [4])0x23a9c6,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x414,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0xffffffffffffff;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_20.size_ = 5;
  format_str_20.data_ = "{0:#}";
  args_20.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_20.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_long>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_20,args_20,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_348,"\"-42\"","format(\"{0:#}\", -42ll)",(char (*) [4])0x23b7d2,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x416,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_21.size_ = 6;
  format_str_21.data_ = "{0:#x}";
  args_21.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_21.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_long>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_21,args_21,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_348,"\"0x42\"","format(\"{0:#x}\", 0x42ll)",(char (*) [5])0x23a986,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x417,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0xffffffffffffff;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_22.size_ = 6;
  format_str_22.data_ = "{0:#x}";
  args_22.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_22.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_long>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_22,args_22,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_348,"\"-0x42\"","format(\"{0:#x}\", -0x42ll)",(char (*) [6])"-0x42",
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x418,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_23.size_ = 6;
  format_str_23.data_ = "{0:#o}";
  args_23.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_23.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_long>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_23,args_23,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_348,"\"042\"","format(\"{0:#o}\", 042ll)",(char (*) [4])0x23a9c6,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x419,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0xffffffffffffff;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_24.size_ = 6;
  format_str_24.data_ = "{0:#o}";
  args_24.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_24.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_long>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_24,args_24,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_348,"\"-042\"","format(\"{0:#o}\", -042ll)",(char (*) [5])"-042",
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x41a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_25.size_ = 5;
  format_str_25.data_ = "{0:#}";
  args_25.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_25.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long_long>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_25,args_25,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&local_348,"\"42\"","format(\"{0:#}\", 42ull)",(char (*) [3])0x242e5f,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x41b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_26.size_ = 6;
  format_str_26.data_ = "{0:#x}";
  args_26.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_26.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long_long>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_26,args_26,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_348,"\"0x42\"","format(\"{0:#x}\", 0x42ull)",(char (*) [5])0x23a986,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x41c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_27.size_ = 6;
  format_str_27.data_ = "{0:#o}";
  args_27.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_27.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long_long>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_27,args_27,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_348,"\"042\"","format(\"{0:#o}\", 042ull)",(char (*) [4])0x23a9c6,
             &local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x41d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = false;
  local_318._1_7_ = 0xc0450000000000;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_28.size_ = 5;
  format_str_28.data_ = "{0:#}";
  args_28.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_28.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,double>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_28,args_28,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&local_348,"\"-42.0000\"","format(\"{0:#}\", -42.0)",
             (char (*) [9])"-42.0000",&local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x422,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = false;
  local_318._1_7_ = 0xa8000000000000;
  local_318.message_.ptr_._0_2_ = 0xc004;
  local_2f0 = 0;
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2e8 = 500;
  format_str_29.size_ = 5;
  format_str_29.data_ = "{0:#}";
  args_29.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_29.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_double>
       ::TYPES;
  local_2f8 = local_2e0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_300,format_str_29,args_29,(locale_ref)0x0);
  local_338._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,local_2f8,local_2f8 + local_2f0);
  local_300.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2f8 != local_2e0) {
    operator_delete(local_2f8);
  }
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&local_348,"\"-42.0000\"","format(\"{0:#}\", -42.0l)",
             (char (*) [9])"-42.0000",&local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x423,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (((local_300.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_300.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_318.success_ == true) {
    local_338._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,"missing \'}\' in format string","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_58[0] = 99;
      local_2f0 = 0;
      local_300.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_2e8 = 500;
      format_str_30.size_ = 4;
      format_str_30.data_ = "{0:#";
      args_30.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_58;
      args_30.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char>
           ::TYPES;
      local_2f8 = local_2e0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_300,format_str_30,args_30,(locale_ref)0x0);
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,local_2f8,local_2f8 + local_2f0);
      local_300.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_2f8 != local_2e0) {
        operator_delete(local_2f8);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_318,
               (char (*) [101])
               "Expected: format(\"{0:#\", \'c\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar1) {
      operator_delete(local_338._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_300);
  if ((undefined8 *)CONCAT62(local_318.message_.ptr_._2_6_,local_318.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)CONCAT62(local_318.message_.ptr_._2_6_,local_318.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_338,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x425,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
  if (((local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_300.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_300.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_318.success_ == true) {
    local_338._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,"invalid format specifier for char","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_48[0] = 99;
      local_2f0 = 0;
      local_300.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_2e8 = 500;
      format_str_31.size_ = 5;
      format_str_31.data_ = "{0:#}";
      args_31.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_48;
      args_31.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char>
           ::TYPES;
      local_2f8 = local_2e0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_300,format_str_31,args_31,(locale_ref)0x0);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,local_2f8,local_2f8 + local_2f0);
      local_300.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_2f8 != local_2e0) {
        operator_delete(local_2f8);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_318,
               (char (*) [102])
               "Expected: format(\"{0:#}\", \'c\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar1) {
      operator_delete(local_338._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_300);
  if ((undefined8 *)CONCAT62(local_318.message_.ptr_._2_6_,local_318.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)CONCAT62(local_318.message_.ptr_._2_6_,local_318.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_338,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x427,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
  if (((local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_300.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_300.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_318.success_ == true) {
    local_338._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,"format specifier requires numeric argument","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_348 = "abc";
      local_2f0 = 0;
      local_300.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_2e8 = 500;
      format_str_32.size_ = 5;
      format_str_32.data_ = "{0:#}";
      args_32.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_348;
      args_32.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char[4]>
           ::TYPES;
      local_2f8 = local_2e0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_300,format_str_32,args_32,(locale_ref)0x0);
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,local_2f8,local_2f8 + local_2f0);
      local_300.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_2f8 != local_2e0) {
        operator_delete(local_2f8);
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_318,
               (char (*) [104])
               "Expected: format(\"{0:#}\", \"abc\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar1) {
      operator_delete(local_338._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_300);
  if ((undefined8 *)CONCAT62(local_318.message_.ptr_._2_6_,local_318.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)CONCAT62(local_318.message_.ptr_._2_6_,local_318.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_338,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x429,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
  if (((local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_300.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_300.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_e8.success_ == true) {
    local_338._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,"format specifier requires numeric argument","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_318.success_ = true;
      local_318._1_7_ = 0;
      local_2f0 = 0;
      local_300.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_2e8 = 500;
      format_str_33.size_ = 5;
      format_str_33.data_ = "{0:#}";
      args_33.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_318;
      args_33.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void*>
           ::TYPES;
      local_2f8 = local_2e0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_300,format_str_33,args_33,(locale_ref)0x0);
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,local_2f8,local_2f8 + local_2f0);
      local_300.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_2f8 != local_2e0) {
        operator_delete(local_2f8);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_e8,
               (char (*) [128])
               "Expected: format(\"{0:#}\", reinterpret_cast<void*>(0x42)) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar1) {
      operator_delete(local_338._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_300);
  if (local_e8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_e8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_338,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x42b,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)&local_300);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
  if (((local_300.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_300.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_300.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(FormatterTest, HashFlag) {
  EXPECT_EQ("42", format("{0:#}", 42));
  EXPECT_EQ("-42", format("{0:#}", -42));
  EXPECT_EQ("0b101010", format("{0:#b}", 42));
  EXPECT_EQ("0B101010", format("{0:#B}", 42));
  EXPECT_EQ("-0b101010", format("{0:#b}", -42));
  EXPECT_EQ("0x42", format("{0:#x}", 0x42));
  EXPECT_EQ("0X42", format("{0:#X}", 0x42));
  EXPECT_EQ("-0x42", format("{0:#x}", -0x42));
  EXPECT_EQ("042", format("{0:#o}", 042));
  EXPECT_EQ("-042", format("{0:#o}", -042));
  EXPECT_EQ("42", format("{0:#}", 42u));
  EXPECT_EQ("0x42", format("{0:#x}", 0x42u));
  EXPECT_EQ("042", format("{0:#o}", 042u));

  EXPECT_EQ("-42", format("{0:#}", -42l));
  EXPECT_EQ("0x42", format("{0:#x}", 0x42l));
  EXPECT_EQ("-0x42", format("{0:#x}", -0x42l));
  EXPECT_EQ("042", format("{0:#o}", 042l));
  EXPECT_EQ("-042", format("{0:#o}", -042l));
  EXPECT_EQ("42", format("{0:#}", 42ul));
  EXPECT_EQ("0x42", format("{0:#x}", 0x42ul));
  EXPECT_EQ("042", format("{0:#o}", 042ul));

  EXPECT_EQ("-42", format("{0:#}", -42ll));
  EXPECT_EQ("0x42", format("{0:#x}", 0x42ll));
  EXPECT_EQ("-0x42", format("{0:#x}", -0x42ll));
  EXPECT_EQ("042", format("{0:#o}", 042ll));
  EXPECT_EQ("-042", format("{0:#o}", -042ll));
  EXPECT_EQ("42", format("{0:#}", 42ull));
  EXPECT_EQ("0x42", format("{0:#x}", 0x42ull));
  EXPECT_EQ("042", format("{0:#o}", 042ull));

  if (FMT_USE_GRISU)
    EXPECT_EQ("-42.0", format("{0:#}", -42.0));
  else
    EXPECT_EQ("-42.0000", format("{0:#}", -42.0));
  EXPECT_EQ("-42.0000", format("{0:#}", -42.0l));
  EXPECT_THROW_MSG(format("{0:#", 'c'),
      format_error, "missing '}' in format string");
  EXPECT_THROW_MSG(format("{0:#}", 'c'),
      format_error, "invalid format specifier for char");
  EXPECT_THROW_MSG(format("{0:#}", "abc"),
      format_error, "format specifier requires numeric argument");
  EXPECT_THROW_MSG(format("{0:#}", reinterpret_cast<void*>(0x42)),
      format_error, "format specifier requires numeric argument");
}